

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_swap.c
# Opt level: O0

REF_STATUS ref_swap_manifold(REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_BOOL *allowed)

{
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rxs_1;
  REF_STATUS ref_private_macro_code_rxs;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_BOOL has_side;
  REF_INT new_cell;
  REF_INT node3;
  REF_INT node2;
  REF_INT nodes [27];
  REF_INT cell_to_swap [2];
  REF_INT ncell;
  REF_CELL ref_cell;
  REF_BOOL *allowed_local;
  REF_INT node1_local;
  REF_INT node0_local;
  REF_GRID ref_grid_local;
  
  unique0x00012000 = ref_grid->cell[3];
  *allowed = 0;
  ref_grid_local._4_4_ = ref_swap_node23(ref_grid,node0,node1,&new_cell,&has_side);
  if (ref_grid_local._4_4_ == 0) {
    ref_grid_local._4_4_ =
         ref_cell_list_with2(stack0xffffffffffffffd0,node0,node1,2,cell_to_swap,nodes + 0x19);
    if (ref_grid_local._4_4_ == 0) {
      if ((long)cell_to_swap[0] == 2) {
        ref_grid_local._4_4_ = ref_cell_nodes(stack0xffffffffffffffd0,nodes[0x19],&node3);
        if (ref_grid_local._4_4_ == 0) {
          node2 = has_side;
          nodes[0] = new_cell;
          node3 = node0;
          ref_grid_local._4_4_ =
               ref_cell_with(stack0xffffffffffffffd0,&node3,&ref_private_macro_code_rss);
          if ((ref_grid_local._4_4_ == 0) || (ref_grid_local._4_4_ == 5)) {
            if (ref_private_macro_code_rss == -1) {
              node2 = new_cell;
              nodes[0] = has_side;
              node3 = node1;
              ref_grid_local._4_4_ =
                   ref_cell_with(stack0xffffffffffffffd0,&node3,&ref_private_macro_code_rss);
              if ((ref_grid_local._4_4_ == 0) || (ref_grid_local._4_4_ == 5)) {
                if (ref_private_macro_code_rss == -1) {
                  ref_grid_local._4_4_ =
                       ref_cell_has_side(stack0xffffffffffffffd0,new_cell,has_side,
                                         &ref_private_macro_code_rss_1);
                  if (ref_grid_local._4_4_ == 0) {
                    if (ref_private_macro_code_rss_1 == 0) {
                      *allowed = 1;
                      ref_grid_local._4_4_ = 0;
                    }
                    else {
                      *allowed = 0;
                      ref_grid_local._4_4_ = 0;
                    }
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c"
                           ,0x1a2,"ref_swap_manifold",(ulong)ref_grid_local._4_4_,"find edge swap");
                  }
                }
                else {
                  *allowed = 0;
                  ref_grid_local._4_4_ = 0;
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c"
                       ,0x19c,"ref_swap_manifold",(ulong)ref_grid_local._4_4_,"with node1 failed");
              }
            }
            else {
              *allowed = 0;
              ref_grid_local._4_4_ = 0;
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",
                   0x192,"ref_swap_manifold",(ulong)ref_grid_local._4_4_,"with node0 failed");
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",
                 0x18c,"ref_swap_manifold",(ulong)ref_grid_local._4_4_,"nodes tri0");
        }
      }
      else {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",
               0x18b,"ref_swap_manifold","there should be two triangles for manifold",2,
               (long)cell_to_swap[0]);
        ref_grid_local._4_4_ = 1;
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",0x18a,
             "ref_swap_manifold",(ulong)ref_grid_local._4_4_,"more then two");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_swap.c",0x188,
           "ref_swap_manifold",(ulong)ref_grid_local._4_4_,"other nodes");
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_swap_manifold(REF_GRID ref_grid, REF_INT node0,
                                     REF_INT node1, REF_BOOL *allowed) {
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT ncell;
  REF_INT cell_to_swap[2];
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT node2, node3;
  REF_INT new_cell;
  REF_BOOL has_side;

  *allowed = REF_FALSE;

  RSS(ref_swap_node23(ref_grid, node0, node1, &node2, &node3), "other nodes");
  RSS(ref_cell_list_with2(ref_cell, node0, node1, 2, &ncell, cell_to_swap),
      "more then two");
  REIS(2, ncell, "there should be two triangles for manifold");
  RSS(ref_cell_nodes(ref_cell, cell_to_swap[0], nodes), "nodes tri0");

  nodes[0] = node0;
  nodes[1] = node3;
  nodes[2] = node2;
  RXS(ref_cell_with(ref_cell, nodes, &new_cell), REF_NOT_FOUND,
      "with node0 failed");
  if (REF_EMPTY != new_cell) {
    *allowed = REF_FALSE;
    return REF_SUCCESS;
  }

  nodes[0] = node1;
  nodes[1] = node2;
  nodes[2] = node3;
  RXS(ref_cell_with(ref_cell, nodes, &new_cell), REF_NOT_FOUND,
      "with node1 failed");
  if (REF_EMPTY != new_cell) {
    *allowed = REF_FALSE;
    return REF_SUCCESS;
  }

  RSS(ref_cell_has_side(ref_cell, node2, node3, &has_side), "find edge swap");
  if (has_side) { /* would create an edge that already exists */
    *allowed = REF_FALSE;
    return REF_SUCCESS;
  }

  *allowed = REF_TRUE;

  return REF_SUCCESS;
}